

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> __thiscall
Parser::parseCommand(Parser *this)

{
  bool bVar1;
  unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> *puVar2;
  Architecture *pAVar3;
  Token *this_00;
  string *args;
  Parser *in_RSI;
  Token *token;
  undefined1 local_60 [24];
  undefined1 local_48 [40];
  unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> local_20;
  unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> command;
  Parser *this_local;
  
  std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>::
  unique_ptr<std::default_delete<CAssemblerCommand>,void>
            ((unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>> *)&local_20);
  updateFileInfo(in_RSI);
  bVar1 = atEnd(in_RSI);
  if (bVar1) {
    std::make_unique<DummyCommand>();
    std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>::
    unique_ptr<DummyCommand,std::default_delete<DummyCommand>,void>
              ((unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>> *)this,
               (unique_ptr<DummyCommand,_std::default_delete<DummyCommand>_> *)(local_48 + 0x10));
    std::unique_ptr<DummyCommand,_std::default_delete<DummyCommand>_>::~unique_ptr
              ((unique_ptr<DummyCommand,_std::default_delete<DummyCommand>_> *)(local_48 + 0x10));
  }
  else {
    parseLabel((Parser *)local_48);
    puVar2 = std::unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>::operator=
                       (&local_20,
                        (unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> *)
                        local_48);
    bVar1 = std::operator!=(puVar2,(nullptr_t)0x0);
    std::unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>::~unique_ptr
              ((unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> *)local_48);
    if (bVar1) {
      std::unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>::unique_ptr
                ((unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> *)this,
                 &local_20);
    }
    else {
      bVar1 = hasError(in_RSI);
      if (bVar1) {
        handleError(this);
      }
      else {
        parseMacroCall((Parser *)(local_60 + 0x10));
        puVar2 = std::unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>::
                 operator=(&local_20,
                           (unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> *
                           )(local_60 + 0x10));
        bVar1 = std::operator!=(puVar2,(nullptr_t)0x0);
        std::unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>::~unique_ptr
                  ((unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> *)
                   (local_60 + 0x10));
        if (bVar1) {
          std::unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>::unique_ptr
                    ((unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> *)this,
                     &local_20);
        }
        else {
          bVar1 = hasError(in_RSI);
          if (bVar1) {
            handleError(this);
          }
          else {
            pAVar3 = Architecture::current();
            (**pAVar3->_vptr_Architecture)(local_60 + 8,pAVar3,in_RSI);
            puVar2 = std::unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>::
                     operator=(&local_20,
                               (unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>
                                *)(local_60 + 8));
            bVar1 = std::operator!=(puVar2,(nullptr_t)0x0);
            std::unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>::~unique_ptr
                      ((unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> *)
                       (local_60 + 8));
            if (bVar1) {
              std::unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>::
              unique_ptr((unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> *)
                         this,&local_20);
            }
            else {
              bVar1 = hasError(in_RSI);
              if (bVar1) {
                handleError(this);
              }
              else {
                parseDirective((Parser *)local_60,(DirectiveMap *)in_RSI);
                puVar2 = std::unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>
                         ::operator=(&local_20,
                                     (unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>
                                      *)local_60);
                bVar1 = std::operator!=(puVar2,(nullptr_t)0x0);
                std::unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>::
                ~unique_ptr((unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>
                             *)local_60);
                if (bVar1) {
                  std::unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>::
                  unique_ptr((unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>
                              *)this,&local_20);
                }
                else {
                  bVar1 = hasError(in_RSI);
                  if (bVar1) {
                    handleError(this);
                  }
                  else {
                    pAVar3 = Architecture::current();
                    (*pAVar3->_vptr_Architecture[1])(&token,pAVar3,in_RSI);
                    puVar2 = std::
                             unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>
                             ::operator=(&local_20,
                                         (unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>
                                          *)&token);
                    bVar1 = std::operator!=(puVar2,(nullptr_t)0x0);
                    std::unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>::
                    ~unique_ptr((unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>
                                 *)&token);
                    if (bVar1) {
                      std::unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>::
                      unique_ptr((unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>
                                  *)this,&local_20);
                    }
                    else {
                      bVar1 = hasError(in_RSI);
                      if (bVar1) {
                        handleError(this);
                      }
                      else {
                        this_00 = peekToken(in_RSI,0);
                        args = Token::getOriginalText_abi_cxx11_(this_00);
                        printError<std::__cxx11::string>(in_RSI,this_00,"Parse error \'%s\'",args);
                        handleError(this);
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  local_48._12_4_ = 1;
  std::unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>::~unique_ptr
            (&local_20);
  return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<CAssemblerCommand> Parser::parseCommand()
{
	std::unique_ptr<CAssemblerCommand> command;

	updateFileInfo();

	if (atEnd())
		return std::make_unique<DummyCommand>();

	if ((command = parseLabel()) != nullptr)
		return command;
	if (hasError())
		return handleError();

	if ((command = parseMacroCall()) != nullptr)
		return command;
	if (hasError())
		return handleError();

	if ((command = Architecture::current().parseDirective(*this)) != nullptr)
		return command;
	if (hasError())
		return handleError();

	if ((command = parseDirective(directives)) != nullptr)
		return command;
	if (hasError())
		return handleError();

	if ((command = Architecture::current().parseOpcode(*this)) != nullptr)
		return command;
	if (hasError())
		return handleError();

	const Token& token = peekToken();
	printError(token,"Parse error '%s'", token.getOriginalText());
	return handleError();
}